

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O2

Map_NodeVec_t * Map_NodeVecAlloc(int nCap)

{
  Map_NodeVec_t *pMVar1;
  Map_Node_t **ppMVar2;
  int iVar3;
  
  pMVar1 = (Map_NodeVec_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nCap - 1U) {
    iVar3 = nCap;
  }
  pMVar1->nSize = 0;
  pMVar1->nCap = iVar3;
  if (iVar3 == 0) {
    ppMVar2 = (Map_Node_t **)0x0;
  }
  else {
    ppMVar2 = (Map_Node_t **)malloc((long)iVar3 << 3);
  }
  pMVar1->pArray = ppMVar2;
  return pMVar1;
}

Assistant:

Map_NodeVec_t * Map_NodeVecAlloc( int nCap )
{
    Map_NodeVec_t * p;
    p = ABC_ALLOC( Map_NodeVec_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( Map_Node_t *, p->nCap ) : NULL;
    return p;
}